

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask,bool includeEmpty,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *genCase)

{
  NodeType NVar1;
  ShaderType SVar2;
  Node *pNVar3;
  StorageQualifier *pSVar4;
  Variable *pVVar5;
  ArrayElement *pAVar6;
  undefined1 local_168 [8];
  SharedPtr variable_8;
  SharedPtr arrayElem_3;
  SharedPtr variable_7;
  SharedPtr structMbr_1;
  SharedPtr variable_6;
  SharedPtr variable_5;
  SharedPtr arrayElem_2;
  SharedPtr patchInput;
  SharedPtr variable_4;
  SharedPtr arrayElem_1;
  SharedPtr variable_3;
  SharedPtr arrayElem;
  SharedPtr variable_2;
  SharedPtr structMbr;
  SharedPtr variable_1;
  SharedPtr variable;
  ShaderType firstStage;
  undefined1 local_48 [8];
  SharedPtr input;
  bool inDefaultBlock;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr *genCase_local;
  bool includeEmpty_local;
  deUint32 presentShadersMask_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  pNVar3 = de::
           SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
           ::operator->(parentStructure);
  NVar1 = ResourceDefinition::Node::getType(pNVar3);
  input.m_state._7_1_ = NVar1 == TYPE_DEFAULT_BLOCK;
  if ((bool)input.m_state._7_1_) {
    pSVar4 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar4,parentStructure,STORAGE_IN);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_48,(Node *)pSVar4);
  }
  else {
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_48,parentStructure);
  }
  SVar2 = getShaderMaskFirstStage(presentShadersMask);
  if ((includeEmpty) && ((input.m_state._7_1_ & 1) != 0)) {
    (*genCase)(context,parentStructure,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,"empty");
  }
  if (SVar2 == SHADERTYPE_VERTEX) {
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)local_48,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_1.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&variable_1.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "var");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_1.m_state);
  }
  else if ((SVar2 == SHADERTYPE_FRAGMENT) || ((input.m_state._7_1_ & 1) == 0)) {
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)local_48,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&structMbr.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&structMbr.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "var");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&structMbr.m_state);
    pNVar3 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar3,(SharedPtr *)local_48);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_2.m_state,pNVar3);
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)&variable_2.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElem.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&arrayElem.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "var_struct");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElem.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_2.m_state);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)local_48,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_3.m_state,(Node *)pAVar6);
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)&variable_3.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElem_1.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&arrayElem_1.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "var_array");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElem_1.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_3.m_state);
  }
  else if ((SVar2 == SHADERTYPE_TESSELLATION_CONTROL) || (SVar2 == SHADERTYPE_GEOMETRY)) {
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)local_48,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_4.m_state,(Node *)pAVar6);
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)&variable_4.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&patchInput.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&patchInput.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "var");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&patchInput.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_4.m_state);
  }
  else if (SVar2 == SHADERTYPE_TESSELLATION_EVALUATION) {
    pSVar4 = (StorageQualifier *)operator_new(0x28);
    ResourceDefinition::StorageQualifier::StorageQualifier(pSVar4,parentStructure,STORAGE_PATCH_IN);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElem_2.m_state,(Node *)pSVar4);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)local_48,-2);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_5.m_state,(Node *)pAVar6);
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)&variable_5.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_6.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&variable_6.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "var");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_6.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_5.m_state);
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)&arrayElem_2.m_state,TYPE_FLOAT_VEC4)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&structMbr_1.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&structMbr_1.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "patch_var");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&structMbr_1.m_state);
    pNVar3 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember
              ((StructMember *)pNVar3,(SharedPtr *)&arrayElem_2.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_7.m_state,pNVar3);
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)&variable_7.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElem_3.m_state,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)&arrayElem_3.m_state,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "patch_var_struct");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElem_3.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_7.m_state);
    pAVar6 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar6,(SharedPtr *)&arrayElem_2.m_state,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&variable_8.m_state,(Node *)pAVar6);
    pVVar5 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar5,(SharedPtr *)&variable_8.m_state,TYPE_FLOAT_VEC4);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_168,(Node *)pVVar5);
    (*genCase)(context,(SharedPtr *)local_168,targetGroup,PROGRAMINTERFACE_PROGRAM_INPUT,
               "patch_var_array");
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_168);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&variable_8.m_state);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElem_2.m_state);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_48);
  return;
}

Assistant:

static void generateProgramInputBlockContents (Context&										context,
											   const ResourceDefinition::Node::SharedPtr&	parentStructure,
											   tcu::TestCaseGroup*							targetGroup,
											   deUint32										presentShadersMask,
											   bool											includeEmpty,
											   void											(*genCase)(Context&										context,
																									   const ResourceDefinition::Node::SharedPtr&	parentStructure,
																									   tcu::TestCaseGroup*							targetGroup,
																									   ProgramInterface								interface,
																									   const char*									name))
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	// .empty
	if (includeEmpty && inDefaultBlock)
		genCase(context, parentStructure, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "empty");

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
		genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_struct");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var");
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_struct");
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}